

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

int regstrcmp(SXML_CHAR *str,SXML_CHAR *pattern)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  
  if (str == (SXML_CHAR *)0x0 && pattern == (SXML_CHAR *)0x0) {
    return 1;
  }
  if (str != (SXML_CHAR *)0x0 && pattern != (SXML_CHAR *)0x0) {
LAB_00106015:
    do {
      cVar3 = *pattern;
      if (cVar3 == '*') {
        while ((cVar3 == '*' || (cVar3 == '?'))) {
          pcVar1 = pattern + 1;
          pattern = pattern + 1;
          cVar3 = *pcVar1;
        }
        str = str + -1;
        do {
          pcVar1 = str + 1;
          str = str + 1;
          if (*pcVar1 == '\0') break;
        } while (*pcVar1 != cVar3);
        goto LAB_00106015;
      }
      if (cVar3 == '?') {
        pattern = pattern + 1;
        str = str + 1;
        goto LAB_00106015;
      }
      if (cVar3 == '\\') {
        cVar3 = pattern[1];
        pattern = pattern + 1;
      }
      else if (cVar3 == '\0') {
        return (int)(*str == '\0');
      }
      pattern = pattern + 1;
      cVar2 = *str;
      str = str + 1;
    } while (cVar3 == cVar2);
  }
  return 0;
}

Assistant:

int regstrcmp(SXML_CHAR* str, SXML_CHAR* pattern)
{
	SXML_CHAR *p, *s;

	if (str == NULL && pattern == NULL)
		return TRUE;

	if (str == NULL || pattern == NULL)
		return FALSE;

	p = pattern;
	s = str;
	for (;;) {
		switch (*p) {
			/* Any character matches, go to next one */
			case C2SX('?'):
				p++;
				s++;
				break;

			/* Go to next character in pattern and wait until it is found in 'str' */
			case C2SX('*'):
				for (; *p != NULC; p++) { /* Squeeze '**?*??**' to '*' */
					if (*p != C2SX('*') && *p != C2SX('?'))
						break;
				}
				for (; *s != NULC; s++) {
					if (*s == *p)
						break;
				}
				break;

			/* NULL character on pattern has to be matched by 'str' */
			case 0:
				return *s ? FALSE : TRUE;

			default:
				if (*p == C2SX('\\')) /* Escape character */
					p++;
				if (*p++ != *s++) /* Characters do not match */
					return FALSE;
				break;
		}
	}

	return FALSE;
}